

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigDup.c
# Opt level: O1

Aig_Man_t * Saig_ManTrimPis(Aig_Man_t *p)

{
  int iVar1;
  char *__s;
  void *pvVar2;
  bool bVar3;
  Aig_Man_t *p_00;
  size_t sVar4;
  char *__dest;
  Vec_Int_t *pVVar5;
  int *piVar6;
  Aig_Obj_t *pAVar7;
  ulong uVar8;
  Vec_Ptr_t *pVVar9;
  int iVar10;
  uint uVar11;
  Aig_Obj_t *p1;
  long lVar12;
  
  iVar1 = p->nTruePis;
  bVar3 = false;
  if (0 < (long)iVar1) {
    uVar11 = p->vCis->nSize;
    if ((int)uVar11 < 1) {
      uVar11 = 0;
    }
    bVar3 = true;
    lVar12 = 0;
    do {
      if (uVar11 <= iVar1 - 1U) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if ((*(uint *)((long)p->vCis->pArray[lVar12] + 0x18) & 0xffffffc0) != 0) {
        bVar3 = false;
      }
      lVar12 = lVar12 + 1;
    } while (iVar1 != lVar12);
    bVar3 = !bVar3;
  }
  p_00 = Aig_ManStart(p->vObjs->nSize - p->nDeleted);
  __s = p->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar4 = strlen(__s);
    __dest = (char *)malloc(sVar4 + 1);
    strcpy(__dest,__s);
  }
  p_00->pName = __dest;
  p_00->nConstrs = p->nConstrs;
  iVar1 = p->nObjs[2];
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  iVar10 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar10 = iVar1;
  }
  pVVar5->nSize = 0;
  pVVar5->nCap = iVar10;
  if (iVar10 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar10 << 2);
  }
  pVVar5->pArray = piVar6;
  p_00->vCiNumsOrig = pVVar5;
  Aig_ManCleanData(p);
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  pVVar9 = p->vCis;
  if (0 < pVVar9->nSize) {
    lVar12 = 0;
    do {
      piVar6 = (int *)pVVar9->pArray[lVar12];
      if (((!bVar3) || ((*(ulong *)(piVar6 + 6) & 0xffffffc0) != 0)) ||
         ((((uint)*(ulong *)(piVar6 + 6) & 7) == 2 && (p->nTruePis <= *piVar6)))) {
        pAVar7 = Aig_ObjCreateCi(p_00);
        *(Aig_Obj_t **)(piVar6 + 10) = pAVar7;
        if (p->vCiNumsOrig->nSize <= lVar12) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        Vec_IntPush(p_00->vCiNumsOrig,p->vCiNumsOrig->pArray[lVar12]);
      }
      lVar12 = lVar12 + 1;
      pVVar9 = p->vCis;
    } while (lVar12 < pVVar9->nSize);
  }
  pVVar9 = p->vObjs;
  if (0 < pVVar9->nSize) {
    lVar12 = 0;
    do {
      pvVar2 = pVVar9->pArray[lVar12];
      if ((pvVar2 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar2 + 0x18) & 7) - 7)) {
        if (((ulong)pvVar2 & 1) != 0) goto LAB_00620ed4;
        uVar8 = *(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe;
        if (uVar8 == 0) {
          pAVar7 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar7 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^ *(ulong *)(uVar8 + 0x28));
        }
        uVar8 = *(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe;
        if (uVar8 == 0) {
          p1 = (Aig_Obj_t *)0x0;
        }
        else {
          p1 = (Aig_Obj_t *)
               ((ulong)((uint)*(ulong *)((long)pvVar2 + 0x10) & 1) ^ *(ulong *)(uVar8 + 0x28));
        }
        pAVar7 = Aig_And(p_00,pAVar7,p1);
        *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar7;
      }
      lVar12 = lVar12 + 1;
      pVVar9 = p->vObjs;
    } while (lVar12 < pVVar9->nSize);
  }
  pVVar9 = p->vCos;
  if (0 < pVVar9->nSize) {
    lVar12 = 0;
    do {
      pvVar2 = pVVar9->pArray[lVar12];
      if (((ulong)pvVar2 & 1) != 0) {
LAB_00620ed4:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar8 = *(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe;
      if (uVar8 == 0) {
        pAVar7 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar7 = (Aig_Obj_t *)
                 ((ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^ *(ulong *)(uVar8 + 0x28));
      }
      pAVar7 = Aig_ObjCreateCo(p_00,pAVar7);
      *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar7;
      lVar12 = lVar12 + 1;
      pVVar9 = p->vCos;
    } while (lVar12 < pVVar9->nSize);
  }
  Aig_ManSetRegNum(p_00,p->nRegs);
  return p_00;
}

Assistant:

Aig_Man_t * Saig_ManTrimPis( Aig_Man_t * p )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i, fAllPisHaveNoRefs;
    // check the refs of PIs    
    fAllPisHaveNoRefs = 1;
    Saig_ManForEachPi( p, pObj, i )
        if ( pObj->nRefs )
            fAllPisHaveNoRefs = 0;
    // start the new manager
    pNew = Aig_ManStart( Aig_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->nConstrs = p->nConstrs;
    // start mapping of the CI numbers
    pNew->vCiNumsOrig = Vec_IntAlloc( Aig_ManCiNum(p) );
    // map const and primary inputs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
        if ( fAllPisHaveNoRefs || pObj->nRefs || Saig_ObjIsLo(p, pObj) )
        {
            pObj->pData = Aig_ObjCreateCi( pNew );
            Vec_IntPush( pNew->vCiNumsOrig, Vec_IntEntry(p->vCiNumsOrig, i) );
        }
    Aig_ManForEachNode( p, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    Aig_ManForEachCo( p, pObj, i )
        pObj->pData = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    return pNew;
}